

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

SymbolListCItr __thiscall
Jinx::Impl::Parser::GetNextSymbolOfType(Parser *this,SymbolType type,SymbolListCItr endSymbol)

{
  bool bVar1;
  pointer pSVar2;
  bool local_41;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_38;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_30;
  SymbolListCItr curr;
  SymbolType type_local;
  Parser *this_local;
  SymbolListCItr endSymbol_local;
  
  local_30._M_current = (this->m_currentSymbol)._M_current;
  curr._M_current._4_4_ = type;
  this_local = (Parser *)endSymbol._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                        *)&this_local);
    local_41 = false;
    if (bVar1) {
      local_38._M_current =
           (Symbol *)
           std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                     (this->m_symbolList);
      local_41 = __gnu_cxx::operator!=(&local_30,&local_38);
    }
    if (local_41 == false) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&local_30);
    if (pSVar2->type == curr._M_current._4_4_) {
      return (SymbolListCItr)local_30._M_current;
    }
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
    ::operator++(&local_30);
  }
  return (SymbolListCItr)(Symbol *)this_local;
}

Assistant:

inline_t SymbolListCItr Parser::GetNextSymbolOfType(SymbolType type, SymbolListCItr endSymbol) const
	{
		auto curr = m_currentSymbol;
		while (curr != endSymbol && curr != m_symbolList.end())
		{
			if (curr->type == type)
			{
				endSymbol = curr;
				break;
			}
			++curr;
		}
		return endSymbol;
	}